

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  int *piVar1;
  ImGuiTextRange *pIVar2;
  char *pcVar3;
  ImGuiTextRange *__dest;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  ImGuiTextRange input_range;
  ImGuiTextRange local_28;
  
  if ((this->Filters).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiTextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar2 = (this->Filters).Data;
    if (pIVar2 != (ImGuiTextRange *)0x0) {
      memcpy(__dest,pIVar2,(long)(this->Filters).Size << 4);
      pIVar2 = (this->Filters).Data;
      if ((pIVar2 != (ImGuiTextRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = 0;
  }
  iVar9 = 0;
  (this->Filters).Size = 0;
  sVar4 = strlen(this->InputBuf);
  local_28.e = this->InputBuf + sVar4;
  local_28.b = this->InputBuf;
  ImGuiTextRange::split(&local_28,',',&this->Filters);
  this->CountGrep = 0;
  uVar5 = (ulong)(uint)(this->Filters).Size;
  if (uVar5 == 0) {
    return;
  }
  pIVar2 = (this->Filters).Data;
  uVar6 = 0;
LAB_0014d766:
  pcVar7 = pIVar2[uVar6].b;
  pcVar3 = pIVar2[uVar6].e;
  pcVar8 = pcVar7;
  if (pcVar7 < pcVar3) {
    do {
      if ((*pcVar7 != ' ') && (pcVar8 = pcVar7, *pcVar7 != '\t')) break;
      pcVar7 = pcVar7 + 1;
      pIVar2[uVar6].b = pcVar7;
      pcVar8 = pcVar3;
    } while (pcVar7 != pcVar3);
  }
  do {
    if (pcVar3 <= pcVar8) break;
    pcVar7 = pcVar3 + -1;
    if ((*pcVar7 != ' ') && (*pcVar7 != '\t')) break;
    pIVar2[uVar6].e = pcVar7;
    pcVar3 = pcVar7;
  } while( true );
  if ((pcVar8 != pcVar3) && (*pcVar8 != '-')) {
    iVar9 = iVar9 + 1;
    this->CountGrep = iVar9;
  }
  uVar6 = uVar6 + 1;
  if (uVar6 == uVar5) {
    return;
  }
  goto LAB_0014d766;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}